

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O2

int light_ip_flow(light_pcapng *sectionp,light_pcapng **flows,size_t *flow_count,size_t *dropped)

{
  uint8_t uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  light_boolean lVar6;
  int iVar7;
  void *__ptr;
  flow_information_t *pfVar8;
  _light_pcapng *p_Var9;
  light_pcapng *pp_Var10;
  light_option option;
  byte bVar11;
  byte *pbVar12;
  ulong uVar13;
  ushort uVar14;
  long lVar15;
  ulong uVar16;
  light_pcapng p_Var17;
  _light_enhanced_packet_block *epb;
  flow_information_t *to_be_deleted;
  flow_information_t *__ptr_00;
  _light_pcapng *pcapng;
  _flow_information *p_Var18;
  ulong uVar19;
  undefined1 auVar20 [16];
  flow_information_t *local_a8;
  light_pcapng local_98;
  address_t local_88;
  address_t local_78;
  light_pcapng *local_68;
  light_pcapng local_60;
  size_t local_58;
  ulong local_50;
  size_t *local_48;
  double local_40;
  ulong local_38;
  
  p_Var17 = *sectionp;
  local_68 = sectionp;
  local_48 = dropped;
  uVar5 = light_get_block_count(p_Var17);
  lVar6 = __is_section_header(p_Var17);
  if (lVar6 == LIGHT_FALSE) {
    fprintf(_stderr,"Error at: %s::%s::%d, %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
            ,"light_ip_flow",0x186,"\"Invalid section header\"");
    iVar7 = -1;
  }
  else {
    pcapng = p_Var17->next_block;
    *flow_count = 0;
    local_38 = (ulong)uVar5;
    local_40 = (double)local_38;
    local_98 = (light_pcapng)0x0;
    __ptr = (void *)0x0;
    local_50 = 0;
    __ptr_00 = (flow_information_t *)0x0;
    local_a8 = (flow_information_t *)0x0;
    local_58 = 0;
    uVar13 = 0;
    local_60 = p_Var17;
    for (; uVar16 = local_50, pcapng != (_light_pcapng *)0x0; pcapng = pcapng->next_block) {
      uVar5 = pcapng->block_type;
      if (uVar5 == 1) {
        uVar19 = (ulong)((int)local_50 + 1);
        __ptr = realloc(__ptr,uVar19 * 8);
        *(_light_pcapng **)((long)__ptr + (uVar16 & 0xffffffff) * 8) = pcapng;
        local_98 = pcapng;
        local_50 = uVar19;
        goto LAB_00103914;
      }
      if (uVar5 == 0xa0d0d0a) {
        *local_68 = pcapng;
        break;
      }
      if ((uVar5 != 6) && (uVar5 != 3)) goto LAB_00103914;
      local_78._0_8_ = 0;
      local_78._8_8_ = 0;
      local_88._0_8_ = 0;
      local_88._8_8_ = 0;
      lVar15 = 0x14;
      if (uVar5 == 6) {
LAB_001036e7:
        puVar2 = pcapng->block_body;
        pbVar12 = (byte *)((long)puVar2 + lVar15 + 0xe);
        uVar14 = *(ushort *)((long)puVar2 + lVar15 + 0xc);
        uVar14 = uVar14 << 8 | uVar14 >> 8;
        if (uVar14 != 0x800) {
          if (uVar14 == 0x9100) {
            pbVar12 = (byte *)((long)puVar2 + lVar15 + 0x14);
          }
          else if (uVar14 != 0x86dd) {
            if (uVar14 != 0x8100) goto LAB_00103786;
            pbVar12 = (byte *)((long)puVar2 + lVar15 + 0x12);
          }
        }
        bVar11 = *pbVar12 >> 4;
        if (bVar11 == 6) {
          for (uVar16 = 0; uVar16 < 0x10; uVar16 = uVar16 + 2) {
            *(ushort *)((long)&local_88 + uVar16) =
                 *(ushort *)(pbVar12 + uVar16 + 8) << 8 | *(ushort *)(pbVar12 + uVar16 + 8) >> 8;
          }
          for (uVar16 = 0; uVar16 < 0x10; uVar16 = uVar16 + 2) {
            *(ushort *)((long)&local_78 + uVar16) =
                 *(ushort *)(pbVar12 + uVar16 + 0x18) << 8 |
                 *(ushort *)(pbVar12 + uVar16 + 0x18) >> 8;
          }
        }
        else {
          if (bVar11 != 4) goto LAB_00103786;
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
            *(byte *)((long)&local_88 + lVar15) = pbVar12[lVar15 + 0xc];
          }
          for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
            *(byte *)((long)&local_78 + lVar15) = pbVar12[lVar15 + 0x10];
          }
        }
        p_Var18 = __ptr_00;
        if (__ptr_00 == (flow_information_t *)0x0) {
          p_Var17 = local_98;
          if (uVar5 != 3) {
            p_Var17 = *(light_pcapng *)((long)__ptr + (ulong)*puVar2 * 8);
          }
          local_a8 = __create_flow(local_60,p_Var17,(flow_address_t *)&local_88,bVar11);
          *flow_count = 1;
          pfVar8 = local_a8;
          p_Var18 = local_a8;
          if (local_a8 != (flow_information_t *)0x0) {
LAB_001038f1:
            p_Var9 = __copy_block(pcapng,LIGHT_FALSE);
            p_Var18->last_block->next_block = p_Var9;
            p_Var18->last_block = p_Var9;
            __ptr_00 = pfVar8;
            goto LAB_00103914;
          }
          local_a8 = (flow_information_t *)0x0;
        }
        else {
          for (; p_Var18 != (flow_information_t *)0x0; p_Var18 = p_Var18->next) {
            if ((p_Var18->version == bVar11) &&
               (((((lVar15 = *(long *)&(p_Var18->address).source, pfVar8 = __ptr_00,
                   lVar15 == local_88._0_8_ &&
                   (*(long *)((long)&(p_Var18->address).source + 8) == local_88._8_8_)) &&
                  (*(long *)&(p_Var18->address).destination == local_78._0_8_)) &&
                 (*(long *)((long)&(p_Var18->address).destination + 8) == local_78._8_8_)) ||
                (((lVar15 == local_78._0_8_ &&
                  (*(long *)((long)&(p_Var18->address).source + 8) == local_78._8_8_)) &&
                 ((*(long *)&(p_Var18->address).destination == local_88._0_8_ &&
                  (*(long *)((long)&(p_Var18->address).destination + 8) == local_88._8_8_))))))))
            goto LAB_001038f1;
          }
        }
        p_Var17 = local_98;
        if (uVar5 != 3) {
          p_Var17 = *(light_pcapng *)((long)__ptr + (ulong)*pcapng->block_body * 8);
        }
        pfVar8 = __create_flow(local_60,p_Var17,(flow_address_t *)&local_88,bVar11);
        local_a8->next = pfVar8;
        *flow_count = *flow_count + 1;
        local_a8 = pfVar8;
      }
      else {
        if (uVar5 == 3) {
          lVar15 = 4;
          goto LAB_001036e7;
        }
LAB_00103786:
        local_58 = local_58 + 1;
      }
LAB_00103914:
      uVar13 = uVar13 + 1;
      if (uVar13 % 10000 == 0) {
        auVar20._8_4_ = (int)(uVar13 >> 0x20);
        auVar20._0_8_ = uVar13;
        auVar20._12_4_ = 0x45300000;
        printf("Flow extraction progress: %.2lf [%zu / %zu]\n",
               SUB84((((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)) / local_40) *
                     100.0,0),uVar13,local_38);
      }
    }
    if (local_48 != (size_t *)0x0) {
      *local_48 = local_58;
    }
    if (pcapng == (_light_pcapng *)0x0) {
      *local_68 = (light_pcapng)0x0;
    }
    pp_Var10 = (light_pcapng *)calloc(*flow_count,8);
    *flows = pp_Var10;
    uVar13 = 0;
    for (p_Var18 = __ptr_00; p_Var18 != (flow_information_t *)0x0; p_Var18 = p_Var18->next) {
      (*flows)[uVar13] = p_Var18->section;
      __validate_section((*flows)[uVar13]);
      p_Var17 = p_Var18->section;
      bVar11 = (p_Var18->version == '\x06') * ' ' + 1;
      if (p_Var18->version == '\x04') {
        bVar11 = 9;
      }
      option = light_alloc_option((ushort)bVar11);
      option->custom_option_code = 0xadd4;
      puVar3 = option->data;
      uVar1 = p_Var18->version;
      *(uint8_t *)puVar3 = uVar1;
      if (uVar1 == '\x06') {
        uVar4 = *(undefined8 *)((long)&(p_Var18->address).source + 8);
        *(undefined8 *)((long)puVar3 + 1) = *(undefined8 *)&(p_Var18->address).source;
        *(undefined8 *)((long)puVar3 + 9) = uVar4;
        uVar4 = *(undefined8 *)((long)&(p_Var18->address).destination + 8);
        *(undefined8 *)((long)puVar3 + 0x11) = *(undefined8 *)&(p_Var18->address).destination;
        *(undefined8 *)((long)puVar3 + 0x19) = uVar4;
      }
      else if (uVar1 == '\x04') {
        *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar3 + 1) = (p_Var18->address).source.ipv4;
        *(anon_union_4_2_095bb53e_for_ipv4 *)((long)puVar3 + 5) =
             (p_Var18->address).destination.ipv4;
      }
      light_add_option(p_Var17,p_Var18->section,option,LIGHT_FALSE);
      uVar13 = (ulong)((int)uVar13 + 1);
    }
    while (__ptr_00 != (flow_information_t *)0x0) {
      p_Var18 = __ptr_00->next;
      free(__ptr_00);
      __ptr_00 = p_Var18;
    }
    free(__ptr);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int light_ip_flow(light_pcapng *sectionp, light_pcapng **flows, size_t *flow_count, size_t *dropped)
{
	light_pcapng section = *sectionp;
	size_t progress = 0;
	size_t limit = light_get_block_count(*sectionp);
	size_t skipped = 0;

	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	light_pcapng current_section = section;
	light_pcapng current_interface = NULL;
	light_pcapng *interface_list = NULL;
	uint32_t interface_list_size = 0;

	flow_information_t *current_flow = NULL;
	flow_information_t *last_flow = NULL;
	light_pcapng current_block = section->next_block;

	*flow_count = 0;

	while (current_block != NULL) {
		uint32_t type = current_block->block_type;
		if (type == LIGHT_SECTION_HEADER_BLOCK) {
			// current_section = current_block;
			*sectionp = current_block;
			break;
		}
		else if (type == LIGHT_INTERFACE_BLOCK) {
			current_interface = current_block;
			interface_list = realloc(interface_list, (interface_list_size + 1) * sizeof(light_pcapng));
			interface_list[interface_list_size] = current_interface;
			interface_list_size++;
		}
		else if (type == LIGHT_ENHANCED_PACKET_BLOCK || type == LIGHT_SIMPLE_PACKET_BLOCK) {
			flow_address_t flow_key = {0};
			uint8_t protocol_version;
			flow_information_t *match = NULL;

			if (__get_address(current_block, &flow_key, &protocol_version) == LIGHT_FALSE) {
				skipped++;
				goto iterate;
			}

			if (current_flow == NULL) { // Beginning of the trace.
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					current_flow = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					current_flow = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}
				match = current_flow;
				last_flow = current_flow;
				*flow_count = 1;
			}
			else {
				match = __find_flow(current_flow, &flow_key, protocol_version);
			}

			if (match == NULL) {
				if (type == LIGHT_SIMPLE_PACKET_BLOCK) {
					match = __create_flow(current_section, current_interface, &flow_key, protocol_version);
				}
				else {
					struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)current_block->block_body;
					match = __create_flow(current_section, interface_list[epb->interface_id], &flow_key, protocol_version);
				}

				last_flow->next = match;
				last_flow = match;
				*flow_count += 1;
			}
			else {
				match->last_block->next_block = __copy_block(current_block, LIGHT_FALSE);
				match->last_block = match->last_block->next_block;
			}
		}
		else {
			// TODO: Append other blocks to all flows accordingly.
		}

iterate:
		progress++;
		if (progress % 10000 == 0) {
			printf("Flow extraction progress: %.2lf [%zu / %zu]\n", (double)progress / limit * 100.0, progress, limit);
		}
		current_block = current_block->next_block;
	}

	if (dropped != NULL) {
		*dropped = skipped;
	}

	// End of trace.
	if (current_block == NULL) {
		*sectionp = NULL;
	}

	*flows = calloc(*flow_count, sizeof(light_pcapng));
	uint32_t index = 0;
	flow_information_t *iterator = current_flow;

	while (iterator != NULL) {
		(*flows)[index] = iterator->section;
		__validate_section((*flows)[index]);
		__append_address_information(iterator->section, iterator);
		index++;
		iterator = iterator->next;
	}

	while (current_flow != NULL) {
		flow_information_t *to_be_deleted = current_flow;
		current_flow = current_flow->next;
		free(to_be_deleted);
	}

	free(interface_list);

	return LIGHT_SUCCESS;
}